

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void for_each_word_enum_cb(void *ctx0,CVmHashEntry *entry0)

{
  vm_obj_id_t obj;
  vm_rcdesc *recurse_ctx;
  vm_dict_entry *funcptr;
  vm_val_t *pvVar1;
  CVmHashEntryDict *in_RSI;
  size_t i;
  vm_dict_entry *p;
  vm_obj_id_t str_obj;
  size_t list_idx;
  CVmHashEntryDict *entry;
  for_each_word_enum_cb_ctx *ctx;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint uVar2;
  undefined8 in_stack_ffffffffffffffc0;
  int in_root_set;
  ulong uVar3;
  uint argc;
  undefined4 in_stack_ffffffffffffffd0;
  ulong local_28;
  
  in_root_set = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  recurse_ctx = (vm_rcdesc *)CVmHashEntry::getstr((CVmHashEntry *)in_RSI);
  CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
  obj = CVmObjString::create
                  (in_root_set,(char *)recurse_ctx,
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_28 = 0;
  while( true ) {
    uVar3 = 0;
    funcptr = CVmHashEntryDict::get_head(in_RSI);
    uVar2 = in_stack_ffffffffffffffb4;
    while( true ) {
      in_stack_ffffffffffffffb4 = uVar2 & 0xffffff;
      if (uVar3 < local_28) {
        in_stack_ffffffffffffffb4 = CONCAT13(funcptr != (vm_dict_entry *)0x0,(int3)uVar2);
      }
      if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') break;
      funcptr = funcptr->nxt_;
      uVar3 = uVar3 + 1;
      uVar2 = in_stack_ffffffffffffffb4;
    }
    if (funcptr == (vm_dict_entry *)0x0) break;
    pvVar1 = CVmStack::push();
    argc = (uint)(uVar3 >> 0x20);
    vm_val_t::set_propid(pvVar1,funcptr->prop_);
    pvVar1 = CVmStack::push();
    vm_val_t::set_obj(pvVar1,obj);
    pvVar1 = CVmStack::push();
    vm_val_t::set_obj(pvVar1,funcptr->obj_);
    CVmRun::call_func_ptr
              ((CVmRun *)CONCAT44(obj,in_stack_ffffffffffffffd0),(vm_val_t *)funcptr,argc,
               recurse_ctx,in_stack_ffffffffffffffb4);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

static void for_each_word_enum_cb(void *ctx0, CVmHashEntry *entry0)
{
    for_each_word_enum_cb_ctx *ctx = (for_each_word_enum_cb_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    size_t list_idx;
    vm_obj_id_t str_obj;

    /* set up access to the VM globals through my stashed context */
    VMGLOB_PTR(ctx->vmg);

    /* create a string object for this entry's word string */
    str_obj = CVmObjString::create(vmg_ FALSE,
                                   entry->getstr(), entry->getlen());

    /* scan the entry's list of word associations */
    for (list_idx = 0 ; ; ++list_idx)
    {
        vm_dict_entry *p;
        size_t i;

        /*
         *   Find the list entry at the current list index.  Note that we
         *   scan the list on each iteration for the current index because
         *   we don't want to keep track of any pointers between iterations;
         *   this insulates us from any changes to the underlying list made
         *   in the callback.  
         */
        for (i = 0, p = entry->get_head() ; i < list_idx && p != 0 ;
             p = p->nxt_, ++i) ;

        /* 
         *   if we didn't find a list entry at this index, we're done with
         *   this hashtable entry 
         */
        if (p == 0)
            break;

        /* 
         *   Invoke the callback on this list entry.  The arguments to the
         *   callback are the object, the string, and the vocabulary
         *   property of the association:
         *   
         *   func(obj, str, prop)
         *   
         *   Note that the order of the arguments is the same as for
         *   addWord() and removeWord().  
         */

        /* push the vocabulary property of the association */
        G_stk->push()->set_propid(p->prop_);

        /* push the string of the entry */
        G_stk->push()->set_obj(str_obj);

        /* push the object of the association */
        G_stk->push()->set_obj(p->obj_);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ ctx->cb_val, 3, &ctx->rc, 0);
    }
}